

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_2,_3> * __thiscall
gl4cts::Math::transpose<double,3,2>
          (Matrix<double,_2,_3> *__return_storage_ptr__,Math *this,Matrix<double,_3,_2> *matrix)

{
  Matrix<double,_3,_2> *matrix_local;
  Matrix<double,_2,_3> *result;
  
  tcu::transpose<double,3,2>(__return_storage_ptr__,(tcu *)this,matrix);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}